

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Point2f __thiscall pbrt::PaddedSobolSampler::Get2D(PaddedSobolSampler *this)

{
  uint uVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint *puVar11;
  ulong uVar12;
  Float FVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM3 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [60];
  
  uVar1 = this->dimension;
  uVar8 = this->samplesPerPixel;
  uVar9 = uVar8 - 1 >> 1 | uVar8 - 1;
  uVar9 = uVar9 >> 2 | uVar9;
  uVar9 = uVar9 >> 4 | uVar9;
  uVar9 = uVar9 >> 8 | uVar9;
  uVar9 = uVar9 >> 0x10 | uVar9;
  uVar5 = (long)*Options ^
          (long)(int)uVar1 << 0x10 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30;
  uVar5 = (uVar5 >> 0x1f ^ uVar5) * 0x7fb5d329728ea185;
  uVar12 = (uVar5 >> 0x1b ^ uVar5) * -0x7e25210b43d22bb3;
  uVar4 = this->sampleIndex;
  uVar5 = uVar12 >> 0x21 ^ uVar12;
  uVar6 = (uint)(uVar5 >> 8);
  do {
    uVar4 = (uVar4 ^ (uint)uVar5) * -0x1e8f76c3 ^ (uint)(uVar5 >> 0x10) & 0xffff;
    uVar4 = ((uVar4 & uVar9) >> 4 ^ uVar6 & 0xffffff ^ uVar4) * 0x929eb3f ^
            (uint)(uVar5 >> 0x17) & 0x1ff;
    uVar4 = ((uVar4 & uVar9) >> 1 ^ uVar4) * ((uint)(uVar5 >> 0x1b) & 0x1f | 1) * 0x6935fa69;
    uVar4 = ((uVar4 & uVar9) >> 0xb ^ uVar4) * 0x74dcb303;
    uVar4 = ((uVar4 & uVar9) >> 2 ^ uVar4) * -0x61afe33d;
    uVar4 = ((uVar4 & uVar9) >> 2 ^ uVar4) * -0x379f5c21 & uVar9;
    uVar4 = uVar4 >> 5 ^ uVar4;
  } while (uVar8 <= uVar4);
  uVar8 = (uVar4 + (uint)uVar5) % uVar8;
  this->dimension = uVar1 + 2;
  if (this->randomizeStrategy == CranleyPatterson) {
    if (((int)uVar1 < 0) ||
       (TVar2 = (this->pixel).super_Tuple2<pbrt::Point2,_int>,
       ((ulong)TVar2 & 0x8000000080000000) != 0)) {
      LogFatal<char_const(&)[42]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bluenoise.h"
                 ,0x1a,"Check failed: %s",(char (*) [42])"textureIndex >= 0 && p.x >= 0 && p.y >= 0"
                );
    }
    uVar6 = TVar2.x & 0x7f;
    uVar9 = 0;
    uVar4 = 0;
    iVar10 = vcvttss2usi_avx512f(ZEXT416((uint)(((float)*(ushort *)
                                                         (BlueNoiseTextures +
                                                         ((ulong)TVar2 >> 0x20 & 0x7f) * 2 +
                                                         (ulong)(uVar6 << 8) +
                                                         (ulong)(uVar1 % 0x30 << 0xf)) / 65535.0) *
                                               4.2949673e+09)));
    if (uVar8 != 0) {
      puVar11 = &SobolMatrices32;
      uVar9 = 0;
      uVar7 = uVar8;
      do {
        if ((uVar7 & 1) != 0) {
          uVar9 = uVar9 ^ *puVar11;
        }
        puVar11 = puVar11 + 1;
        bVar3 = 1 < uVar7;
        uVar7 = (int)uVar7 >> 1;
      } while (bVar3);
    }
    auVar16 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,uVar9 + iVar10);
    iVar10 = vcvttss2usi_avx512f(ZEXT416((uint)(((float)*(ushort *)
                                                         (BlueNoiseTextures +
                                                         ((ulong)TVar2 >> 0x20 & 0x7f) * 2 +
                                                         (ulong)(uVar6 << 8) +
                                                         (ulong)((uVar1 + 1) % 0x30 << 0xf)) /
                                                65535.0) * 4.2949673e+09)));
    if (uVar8 != 0) {
      puVar11 = &DAT_02c6e2a0;
      uVar4 = 0;
      do {
        if ((uVar8 & 1) != 0) {
          uVar4 = uVar4 ^ *puVar11;
        }
        puVar11 = puVar11 + 1;
        bVar3 = 1 < uVar8;
        uVar8 = (int)uVar8 >> 1;
      } while (bVar3);
    }
    auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)));
    auVar14 = vcvtusi2ss_avx512f(in_XMM3,uVar4 + iVar10);
    auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)(auVar14._0_4_ * 2.3283064e-10)));
  }
  else {
    FVar13 = SampleDimension(this,0,uVar8,uVar6);
    auVar15._0_4_ = SampleDimension(this,1,uVar8,(uint32_t)(uVar12 >> 0x20));
    auVar15._4_60_ = extraout_var;
    auVar14 = auVar15._0_16_;
    auVar16._4_4_ = extraout_XMM0_Db;
    auVar16._0_4_ = FVar13;
    auVar16._8_4_ = extraout_XMM0_Dc;
    auVar16._12_4_ = extraout_XMM0_Dd;
  }
  auVar16 = vinsertps_avx(auVar16,auVar14,0x10);
  return (Point2f)auVar16._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Get permuted index for current pixel sample
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);

        int dim = dimension;
        dimension += 2;
        // Return randomized 2D Sobol' sample
        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson) {
            // Return 2D sample randomized with Cranley-Patterson rotation
            return {SobolSample(index, 0, CranleyPattersonRotator(BlueNoise(dim, pixel))),
                    SobolSample(index, 1,
                                CranleyPattersonRotator(BlueNoise(dim + 1, pixel)))};

        } else
            return {SampleDimension(0, index, hash >> 8),
                    SampleDimension(1, index, hash >> 32)};
    }